

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall CP::vector<int>::resize(vector<int> *this,size_t n)

{
  ulong uVar1;
  
  if (this->mCap < n) {
    expand(this,n);
  }
  uVar1 = this->mSize;
  if (uVar1 <= n && n - uVar1 != 0) {
    memset(this->mData + uVar1,0,(n - uVar1) * 4);
  }
  this->mSize = n;
  return;
}

Assistant:

void resize(size_t n) {
      if (n > mCap)
        expand(n);

      if (n > mSize) {
        T init = T();
        for (size_t i = mSize;i < n;i++) 
          mData[i] = init;
      }


      mSize = n;
    }